

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O3

void __thiscall
QTreeViewPrivate::layout
          (QTreeViewPrivate *this,int i,bool recursiveExpanding,bool afterIsUninitialized)

{
  QList<QTreeViewItem> *this_00;
  QSet<QPersistentModelIndex> *this_01;
  QTreeViewItem *pQVar1;
  byte bVar2;
  QObject *this_02;
  QTreeViewItem *pQVar3;
  QAbstractItemModel *pQVar4;
  long lVar5;
  QWidgetData *pQVar6;
  Data *pDVar7;
  Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_> *pDVar8
  ;
  Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *pDVar9;
  char cVar10;
  bool bVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  pointer pQVar15;
  Node<QPersistentModelIndex,_QHashDummyValue> *pNVar16;
  ulong uVar17;
  ulong extraout_RDX;
  int iVar18;
  int iVar19;
  ulong uVar20;
  ulong uVar21;
  int iVar22;
  uint uVar23;
  ulong uVar24;
  long in_FS_OFFSET;
  bool bVar25;
  Bucket BVar26;
  QModelIndex ret;
  ulong local_d8;
  undefined1 *local_a8;
  undefined1 *puStack_a0;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_98;
  undefined1 *local_88;
  QModelIndex *pQStack_80;
  totally_ordered_wrapper<const_QAbstractItemModel_*> tStack_78;
  QHashDummyValue local_69;
  undefined1 *local_68;
  QModelIndex *pQStack_60;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_58;
  int local_50;
  undefined8 local_4c;
  long local_38;
  
  uVar21 = (ulong)(uint)i;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_02 = *(QObject **)
             &(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
              super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  local_88 = (QPersistentModelIndexData *)0xffffffffffffffff;
  pQStack_80 = (QModelIndex *)0x0;
  tStack_78.ptr = (QAbstractItemModel *)0x0;
  local_98.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_a8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_a0 = &DAT_aaaaaaaaaaaaaaaa;
  if (i < 0) {
    QPersistentModelIndex::operator_cast_to_QModelIndex
              ((QModelIndex *)&local_a8,&(this->super_QAbstractItemViewPrivate).root);
    uVar20 = (this->viewItems).d.size;
  }
  else {
    uVar20 = (this->viewItems).d.size;
    if (uVar20 <= uVar21) goto LAB_005a4802;
    pQVar3 = (this->viewItems).d.ptr;
    pQVar1 = pQVar3 + uVar21;
    local_a8 = *(undefined1 **)&pQVar1->index;
    puStack_a0 = (undefined1 *)(pQVar1->index).i;
    local_98.ptr = pQVar3[uVar21].index.m.ptr;
    if ((((pQVar1->index).r < 0) || ((pQVar1->index).c < 0)) ||
       (local_98.ptr == (QAbstractItemModel *)0x0)) goto LAB_005a4802;
  }
  pQVar4 = (this->super_QAbstractItemViewPrivate).model;
  cVar10 = (**(code **)(*(long *)pQVar4 + 0x88))(pQVar4,&local_a8);
  uVar17 = 0;
  if (cVar10 != '\0') {
    pQVar4 = (this->super_QAbstractItemViewPrivate).model;
    cVar10 = (**(code **)(*(long *)pQVar4 + 0x130))(pQVar4,&local_a8);
    pQVar4 = (this->super_QAbstractItemViewPrivate).model;
    lVar5 = *(long *)pQVar4;
    if (cVar10 == '\0') {
      uVar14 = (**(code **)(lVar5 + 0x78))(pQVar4,&local_a8);
      uVar17 = (ulong)uVar14;
    }
    else {
      (**(code **)(lVar5 + 0x128))();
      iVar12 = this->defaultItemHeight;
      if (iVar12 < 1) {
        iVar18 = 0;
        iVar12 = (**(code **)(*(long *)this_02 + 0x1f8))(this_02,0);
        uVar17 = extraout_RDX;
        if (iVar12 != 0) goto LAB_005a4157;
      }
      else {
LAB_005a4157:
        pQVar6 = ((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport)
                 ->data;
        iVar13 = ((pQVar6->crect).y2.m_i - (pQVar6->crect).y1.m_i) + 1;
        iVar18 = iVar13 / iVar12;
        uVar17 = (long)iVar13 % (long)iVar12 & 0xffffffff;
      }
      pQVar4 = (this->super_QAbstractItemViewPrivate).model;
      uVar14 = (**(code **)(*(long *)pQVar4 + 0x78))(pQVar4,&local_a8,uVar17);
      uVar24 = (ulong)uVar14;
      uVar17 = uVar24;
      if (uVar14 != 0xffffffff && (int)uVar14 < iVar18) {
        while (pQVar4 = (this->super_QAbstractItemViewPrivate).model,
              cVar10 = (**(code **)(*(long *)pQVar4 + 0x130))(pQVar4,&local_a8), uVar17 = uVar24,
              cVar10 != '\0') {
          pQVar4 = (this->super_QAbstractItemViewPrivate).model;
          (**(code **)(*(long *)pQVar4 + 0x128))(pQVar4,&local_a8);
          pQVar4 = (this->super_QAbstractItemViewPrivate).model;
          uVar14 = (**(code **)(*(long *)pQVar4 + 0x78))(pQVar4,&local_a8);
          uVar17 = (ulong)uVar14;
          if ((iVar18 <= (int)uVar14) ||
             (uVar23 = (uint)uVar24, uVar24 = (ulong)uVar14, uVar14 == uVar23)) break;
        }
      }
    }
  }
  this_00 = &this->viewItems;
  uVar14 = (uint)uVar17;
  if (i == -1) {
    if (this->uniformRowHeights == true) {
      local_58.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      local_68 = &DAT_aaaaaaaaaaaaaaaa;
      pQStack_60 = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
      pQVar4 = (this->super_QAbstractItemViewPrivate).model;
      (**(code **)(*(long *)pQVar4 + 0x60))((QModelIndex *)&local_68,pQVar4,0,0,&local_a8);
      iVar12 = QTreeView::indexRowSizeHint((QTreeView *)this_02,(QModelIndex *)&local_68);
      this->defaultItemHeight = iVar12;
    }
    QList<QTreeViewItem>::resize(this_00,(long)(int)uVar14);
    afterIsUninitialized = true;
    iVar12 = 0;
    bVar25 = true;
LAB_005a42c5:
    local_d8 = 0;
  }
  else {
    pQVar15 = QList<QTreeViewItem>::data(this_00);
    bVar25 = *(uint *)&pQVar15[i].field_0x1c >> 4 != uVar14;
    if (bVar25) {
      if (afterIsUninitialized) {
        if (0 < (int)uVar14) {
          QList<QTreeViewItem>::resize(this_00,uVar17 + (this->viewItems).d.size);
        }
      }
      else {
        local_68 = (QPersistentModelIndexData *)0xffffffffffffffff;
        pQStack_60 = (QModelIndex *)0x0;
        local_58.ptr = (QAbstractItemModel *)0x0;
        local_50 = -1;
        local_4c = 0;
        insertViewItems(this,i + 1,uVar14,(QTreeViewItem *)&local_68);
      }
    }
    iVar12 = i + 1;
    if (i < 0) goto LAB_005a42c5;
    local_d8 = *(long *)&(this->viewItems).d.ptr[uVar21].field_0x1c + 0x100000000U & 0xffff00000000;
  }
  if ((int)uVar14 < 1) {
    uVar23 = 0;
  }
  else {
    iVar13 = uVar14 + iVar12;
    this_01 = &this->expandedIndexes;
    iVar22 = 0;
    pQVar15 = (pointer)0x0;
    iVar18 = 0;
    uVar23 = 0;
    do {
      pQVar4 = (this->super_QAbstractItemViewPrivate).model;
      (**(code **)(*(long *)pQVar4 + 0x60))
                ((QModelIndexWrapper *)&local_68,pQVar4,iVar22,0,&local_a8);
      tStack_78.ptr = local_58.ptr;
      local_88 = local_68;
      pQStack_80 = pQStack_60;
      pDVar7 = (this->hiddenIndexes).q_hash.d;
      if (((pDVar7 == (Data *)0x0) || (pDVar7->size == 0)) ||
         (pDVar8 = *(Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
                     **)(*(long *)((this->super_QAbstractItemViewPrivate).model + 8) + 0x90),
         pDVar8 == (Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
                    *)0x0)) {
LAB_005a4427:
        if (pQVar15 != (pointer)0x0) {
          pQVar15->field_0x1c = pQVar15->field_0x1c | 8;
        }
        iVar19 = (iVar18 - uVar23) + iVar12;
        pQVar15 = QList<QTreeViewItem>::data(this_00);
        pQVar15 = pQVar15 + iVar19;
        *(undefined1 **)&pQVar15->index = local_88;
        (pQVar15->index).i = (quintptr)pQStack_80;
        (pQVar15->index).m.ptr = tStack_78.ptr;
        pQVar15->parentItem = i;
        *(ulong *)&pQVar15->field_0x1c = *(uint *)&pQVar15->field_0x1c | local_d8;
        bVar11 = QTreeView::isFirstColumnSpanned
                           ((QTreeView *)this_02,(int)local_88,(QModelIndex *)&local_a8);
        *(ulong *)&pQVar15->field_0x1c =
             (*(ulong *)&pQVar15->field_0x1c & 0xffffffff00000004) + (ulong)bVar11 * 2;
        if ((recursiveExpanding) &&
           ((tStack_78.ptr == (QAbstractItemModel *)0x0 ||
            (cVar10 = (**(code **)(*(long *)tStack_78.ptr + 0x138))(tStack_78.ptr,&local_88),
            -1 < cVar10)))) {
LAB_005a44e1:
          QPersistentModelIndex::QPersistentModelIndex
                    ((QPersistentModelIndex *)&local_68,(QModelIndex *)&local_88);
          pDVar9 = (this_01->q_hash).d;
          if ((pDVar9 == (Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *)0x0)
             || (pNVar16 = QHashPrivate::
                           Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_>::
                           findNode<QPersistentModelIndex>
                                     (pDVar9,(QPersistentModelIndex *)&local_68),
                pNVar16 == (Node<QPersistentModelIndex,_QHashDummyValue> *)0x0)) {
            QHash<QPersistentModelIndex,QHashDummyValue>::emplace<QHashDummyValue_const&>
                      ((QHash<QPersistentModelIndex,QHashDummyValue> *)this_01,
                       (QPersistentModelIndex *)&local_68,&local_69);
            bVar2 = *(byte *)(*(long *)(this_02 + 8) + 0x30);
            QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_68);
            if ((bVar2 & 2) == 0) {
              local_68 = (QPersistentModelIndexData *)0x0;
              pQStack_60 = (QModelIndex *)&local_88;
              QMetaObject::activate(this_02,&QTreeView::staticMetaObject,0,&local_68);
            }
          }
          else {
            QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_68);
          }
LAB_005a468a:
          pQVar15->field_0x1c = pQVar15->field_0x1c | 1;
          layout(this,iVar19,recursiveExpanding,afterIsUninitialized);
          pQVar15 = QList<QTreeViewItem>::data(this_00);
          pQVar15 = pQVar15 + iVar19;
          uVar17 = *(ulong *)&pQVar15->field_0x1c;
          iVar18 = iVar18 + ((uint)(uVar17 >> 4) & 0xfffffff);
          *(ulong *)&pQVar15->field_0x1c =
               (uVar17 & 0xfffffffffffffffb) + (ulong)(0xf < (uint)uVar17) * 4;
          iVar19 = (iVar18 - uVar23) + iVar12;
        }
        else {
          if ((tStack_78.ptr == (QAbstractItemModel *)0x0) ||
             (cVar10 = (**(code **)(*(long *)tStack_78.ptr + 0x138))(tStack_78.ptr,&local_88),
             -1 < cVar10)) {
            local_58.ptr = tStack_78.ptr;
            local_68 = local_88;
            pQStack_60 = pQStack_80;
            pDVar8 = *(Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
                       **)(*(long *)((this->super_QAbstractItemViewPrivate).model + 8) + 0x90);
            if (pDVar8 != (Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
                           *)0x0) {
              BVar26 = QHashPrivate::
                       Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
                       ::findBucket<QtPrivate::QModelIndexWrapper>
                                 (pDVar8,(QModelIndexWrapper *)&local_68);
              if ((BVar26.span[BVar26.index] != (Span)0xff) && (*(long *)(BVar26.span + 0x80) != 0))
              {
                QPersistentModelIndex::QPersistentModelIndex
                          ((QPersistentModelIndex *)&local_68,(QModelIndex *)&local_88);
                pDVar9 = (this_01->q_hash).d;
                if (pDVar9 == (Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *)
                              0x0) {
                  QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_68);
                }
                else {
                  pNVar16 = QHashPrivate::
                            Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_>::
                            findNode<QPersistentModelIndex>
                                      (pDVar9,(QPersistentModelIndex *)&local_68);
                  QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_68);
                  if (pNVar16 != (Node<QPersistentModelIndex,_QHashDummyValue> *)0x0) {
                    if (recursiveExpanding) goto LAB_005a44e1;
                    goto LAB_005a468a;
                  }
                }
              }
            }
          }
          iVar19 = (iVar12 - uVar23) + iVar18;
          bVar11 = hasVisibleChildren(this,(QModelIndex *)&local_88);
          *(ulong *)&pQVar15->field_0x1c =
               (*(ulong *)&pQVar15->field_0x1c & 0xfffffffffffffffb) + (ulong)bVar11 * 4;
        }
      }
      else {
        BVar26 = QHashPrivate::
                 Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
                 ::findBucket<QtPrivate::QModelIndexWrapper>(pDVar8,(QModelIndexWrapper *)&local_68)
        ;
        if ((BVar26.span[BVar26.index] == (Span)0xff) || (*(long *)(BVar26.span + 0x80) == 0))
        goto LAB_005a4427;
        QPersistentModelIndex::QPersistentModelIndex
                  ((QPersistentModelIndex *)&local_68,(QModelIndex *)&local_88);
        pDVar9 = (this->hiddenIndexes).q_hash.d;
        if (pDVar9 == (Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *)0x0) {
          QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_68);
          goto LAB_005a4427;
        }
        pNVar16 = QHashPrivate::Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_>::
                  findNode<QPersistentModelIndex>(pDVar9,(QPersistentModelIndex *)&local_68);
        QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_68);
        if (pNVar16 == (Node<QPersistentModelIndex,_QHashDummyValue> *)0x0) goto LAB_005a4427;
        iVar19 = ~uVar23 + iVar18 + iVar12;
        uVar23 = uVar23 + 1;
      }
      iVar12 = iVar12 + 1;
      iVar22 = iVar22 + 1;
    } while (iVar12 < iVar13);
    if (0 < (int)uVar23) {
      if (afterIsUninitialized == false) {
        removeViewItems(this,iVar19 + 1,uVar23);
      }
      else {
        QList<QTreeViewItem>::resize(this_00,(this->viewItems).d.size - (ulong)uVar23);
      }
    }
  }
  if (bVar25 && -1 < i) {
    do {
      pQVar15 = QList<QTreeViewItem>::data(this_00);
      *(ulong *)&pQVar15[uVar21].field_0x1c =
           *(ulong *)&pQVar15[uVar21].field_0x1c & 0xffffffff0000000f |
           (ulong)((uVar14 - uVar23) * 0x10 + (int)*(ulong *)&pQVar15[uVar21].field_0x1c &
                  0xfffffff0);
      pQVar15 = QList<QTreeViewItem>::data(this_00);
      pQVar15 = pQVar15 + uVar21;
      uVar21 = (ulong)(uint)pQVar15->parentItem;
    } while (-1 < pQVar15->parentItem);
  }
  this->pendingAccessibilityUpdate =
       (bool)(this->pendingAccessibilityUpdate | (this->viewItems).d.size != uVar20);
LAB_005a4802:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTreeViewPrivate::layout(int i, bool recursiveExpanding, bool afterIsUninitialized)
{
    Q_Q(QTreeView);
    QModelIndex current;
    QModelIndex parent = (i < 0) ? (QModelIndex)root : modelIndex(i);

    if (i>=0 && !parent.isValid()) {
        //modelIndex() should never return something invalid for the real items.
        //This can happen if columncount has been set to 0.
        //To avoid infinite loop we stop here.
        return;
    }

#if QT_CONFIG(accessibility)
    // QAccessibleTree's rowCount implementation uses viewItems.size(), so
    // we need to invalidate any cached accessibility data structures if
    // that value changes during the run of this function.
    const auto resetModelIfNeeded = qScopeGuard([oldViewItemsSize = viewItems.size(), this]{
        pendingAccessibilityUpdate |= oldViewItemsSize != viewItems.size();
    });
#endif

    int count = 0;
    if (model->hasChildren(parent)) {
        if (model->canFetchMore(parent)) {
            // fetchMore first, otherwise we might not yet have any data for sizeHintForRow
            model->fetchMore(parent);
            // guestimate the number of items in the viewport, and fetch as many as might fit
            const int itemHeight = defaultItemHeight <= 0 ? q->sizeHintForRow(0) : defaultItemHeight;
            const int viewCount = itemHeight ? viewport->height() / itemHeight : 0;
            int lastCount = -1;
            while ((count = model->rowCount(parent)) < viewCount &&
                   count != lastCount && model->canFetchMore(parent)) {
                model->fetchMore(parent);
                lastCount = count;
            }
        } else {
            count = model->rowCount(parent);
        }
    }

    bool expanding = true;
    if (i == -1) {
        if (uniformRowHeights) {
            QModelIndex index = model->index(0, 0, parent);
            defaultItemHeight = q->indexRowSizeHint(index);
        }
        viewItems.resize(count);
        afterIsUninitialized = true;
    } else if (q20::cmp_not_equal(viewItems[i].total, count)) {
        if (!afterIsUninitialized)
            insertViewItems(i + 1, count, QTreeViewItem()); // expand
        else if (count > 0)
            viewItems.resize(viewItems.size() + count);
    } else {
        expanding = false;
    }

    int first = i + 1;
    int level = (i >= 0 ? viewItems.at(i).level + 1 : 0);
    int hidden = 0;
    int last = 0;
    int children = 0;
    QTreeViewItem *item = nullptr;
    for (int j = first; j < first + count; ++j) {
        current = model->index(j - first, 0, parent);
        if (isRowHidden(current)) {
            ++hidden;
            last = j - hidden + children;
        } else {
            last = j - hidden + children;
            if (item)
                item->hasMoreSiblings = true;
            item = &viewItems[last];
            item->index = current;
            item->parentItem = i;
            item->level = level;
            item->height = 0;
            item->spanning = q->isFirstColumnSpanned(current.row(), parent);
            item->expanded = false;
            item->total = 0;
            item->hasMoreSiblings = false;
            if ((recursiveExpanding && !(current.flags() & Qt::ItemNeverHasChildren)) || isIndexExpanded(current)) {
                if (recursiveExpanding && storeExpanded(current) && !q->signalsBlocked())
                    emit q->expanded(current);
                item->expanded = true;
                layout(last, recursiveExpanding, afterIsUninitialized);
                item = &viewItems[last];
                children += item->total;
                item->hasChildren = item->total > 0;
                last = j - hidden + children;
            } else {
                item->hasChildren = hasVisibleChildren(current);
            }
        }
    }

    // remove hidden items
    if (hidden > 0) {
        if (!afterIsUninitialized)
            removeViewItems(last + 1, hidden);
        else
            viewItems.resize(viewItems.size() - hidden);
    }

    if (!expanding)
        return; // nothing changed

    while (i > -1) {
        viewItems[i].total += count - hidden;
        i = viewItems[i].parentItem;
    }
}